

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O2

void __thiscall
embree::sse2::SubdivMeshISA::interpolate(SubdivMeshISA *this,RTCInterpolateArguments *args)

{
  float u;
  float v;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  RawBufferView *pRVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  pointer pvVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  vfloat_impl<4> *dPdv;
  vfloat_impl<4> *ddPdudu;
  vfloat_impl<4> *ddPdvdv;
  vfloat_impl<4> *ddPdudv;
  reference entry;
  ulong stride;
  vfloat_impl<4> *P;
  vfloat_impl<4> *dPdu;
  vfloat4 *pvVar15;
  size_t j;
  vector<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  *pvVar16;
  ulong uVar17;
  Topology *pTVar18;
  long lVar19;
  ulong uVar20;
  bool bVar21;
  vfloat4 ddPdudvt;
  vfloat4 ddPdvdvt;
  vfloat4 ddPdudut;
  vfloat4 dPdvt;
  vfloat4 dPdut;
  vfloat4 Pt;
  PatchEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> local_60;
  
  uVar1 = args->primID;
  uVar2 = args->bufferSlot;
  pfVar4 = args->P;
  pfVar5 = args->dPdu;
  pfVar6 = args->ddPdudu;
  if (args->bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
    pRVar7 = (this->super_SubdivMesh).vertexAttribs.items;
    pvVar16 = &(this->super_SubdivMesh).vertex_attrib_buffer_tags;
    pTVar18 = (this->super_SubdivMesh).topology.items + pRVar7[uVar2].userData;
  }
  else {
    pRVar7 = &((this->super_SubdivMesh).vertices.items)->super_RawBufferView;
    pvVar16 = &(this->super_SubdivMesh).vertex_buffer_tags;
    pTVar18 = (this->super_SubdivMesh).topology.items;
  }
  u = args->u;
  v = args->v;
  pfVar8 = args->dPdv;
  pfVar9 = args->ddPdvdv;
  pfVar10 = args->ddPdudv;
  uVar3 = args->valueCount;
  pvVar11 = (pvVar16->
            super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  stride = (ulong)(uint)pRVar7[uVar2].stride;
  P = &Pt;
  if (pfVar4 == (float *)0x0) {
    P = (vfloat_impl<4> *)0x0;
  }
  dPdu = &dPdut;
  if (pfVar5 == (float *)0x0) {
    dPdu = (vfloat_impl<4> *)0x0;
  }
  pcVar12 = pRVar7[uVar2].ptr_ofs;
  dPdv = &dPdvt;
  if (pfVar5 == (float *)0x0) {
    dPdv = (vfloat_impl<4> *)0x0;
  }
  bVar21 = pfVar6 == (float *)0x0;
  ddPdudu = &ddPdudut;
  if (bVar21) {
    ddPdudu = (vfloat_impl<4> *)0x0;
  }
  ddPdvdv = &ddPdvdvt;
  if (bVar21) {
    ddPdvdv = (vfloat_impl<4> *)0x0;
  }
  ddPdudv = &ddPdudvt;
  if (bVar21) {
    ddPdudv = (vfloat_impl<4> *)0x0;
  }
  uVar14 = 0;
  while (uVar14 < uVar3) {
    uVar20 = (ulong)uVar14;
    entry = std::
            vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
            ::at(pvVar11 + uVar2,(ulong)(uVar14 >> 2) + (stride + 0xf >> 4) * (ulong)uVar1);
    PatchEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::PatchEval
              (&local_60,entry,(this->super_SubdivMesh).commitCounter,
               (pTVar18->halfEdges).items + (pTVar18->mesh->faceStartEdge).items[uVar1],
               pcVar12 + uVar20 * 4,stride,u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv);
    if (pfVar4 != (float *)0x0) {
      uVar13 = uVar14 + 4;
      if (uVar3 <= uVar14 + 4) {
        uVar13 = uVar3;
      }
      pvVar15 = &Pt;
      for (uVar17 = uVar20; uVar17 < uVar13; uVar17 = uVar17 + 1) {
        pfVar4[uVar17] = (pvVar15->field_0).v[0];
        pvVar15 = (vfloat4 *)((long)&pvVar15->field_0 + 4);
      }
    }
    if (pfVar5 != (float *)0x0) {
      uVar13 = uVar14 + 4;
      if (uVar3 <= uVar14 + 4) {
        uVar13 = uVar3;
      }
      for (lVar19 = 0; uVar20 + lVar19 < (ulong)uVar13; lVar19 = lVar19 + 1) {
        pfVar5[uVar20 + lVar19] = dPdut.field_0.v[lVar19];
        pfVar8[uVar20 + lVar19] = dPdvt.field_0.v[lVar19];
      }
    }
    uVar14 = uVar14 + 4;
    if (pfVar6 != (float *)0x0) {
      uVar13 = uVar3;
      if (uVar14 < uVar3) {
        uVar13 = uVar14;
      }
      for (lVar19 = 0; uVar20 + lVar19 < (ulong)uVar13; lVar19 = lVar19 + 1) {
        pfVar6[uVar20 + lVar19] = ddPdudut.field_0.v[lVar19];
        pfVar9[uVar20 + lVar19] = ddPdvdvt.field_0.v[lVar19];
        pfVar10[uVar20 + lVar19] = ddPdudvt.field_0.v[lVar19];
      }
    }
  }
  return;
}

Assistant:

void SubdivMeshISA::interpolate(const RTCInterpolateArguments* const args)
    {
      unsigned int primID = args->primID;
      float u = args->u;
      float v = args->v;
      RTCBufferType bufferType = args->bufferType;
      unsigned int bufferSlot = args->bufferSlot;
      float* P = args->P;
      float* dPdu = args->dPdu;
      float* dPdv = args->dPdv;
      float* ddPdudu = args->ddPdudu;
      float* ddPdvdv = args->ddPdvdv;
      float* ddPdudv = args->ddPdudv;
      unsigned int valueCount = args->valueCount;
      
      /* calculate base pointer and stride */
      assert((bufferType == RTC_BUFFER_TYPE_VERTEX && bufferSlot < RTC_MAX_TIME_STEP_COUNT) ||
             (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE && bufferSlot < RTC_MAX_USER_VERTEX_BUFFERS));
      const char* src = nullptr; 
      size_t stride = 0;
      std::vector<SharedLazyTessellationCache::CacheEntry>* baseEntry = nullptr;
      Topology* topo = nullptr;
      if (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
        assert(bufferSlot < vertexAttribs.size());
        src    = vertexAttribs[bufferSlot].getPtr();
        stride = vertexAttribs[bufferSlot].getStride();
        baseEntry = &vertex_attrib_buffer_tags[bufferSlot];
        int topologyID = vertexAttribs[bufferSlot].userData;
        topo = &topology[topologyID];
      } else {
        assert(bufferSlot < numTimeSteps);
        src    = vertices[bufferSlot].getPtr();
        stride = vertices[bufferSlot].getStride();
        baseEntry = &vertex_buffer_tags[bufferSlot];
        topo = &topology[0];
      }
      
      bool has_P = P;
      bool has_dP = dPdu;     assert(!has_dP  || dPdv);
      bool has_ddP = ddPdudu; assert(!has_ddP || (ddPdvdv && ddPdudu));
      
      for (unsigned int i=0; i<valueCount; i+=4)
      {
        vfloat4 Pt, dPdut, dPdvt, ddPdudut, ddPdvdvt, ddPdudvt;
        isa::PatchEval<vfloat4,vfloat4>(baseEntry->at(interpolationSlot(primID,i/4,stride)),commitCounter,
                                        topo->getHalfEdge(primID),src+i*sizeof(float),stride,u,v,
                                        has_P ? &Pt : nullptr, 
                                        has_dP ? &dPdut : nullptr, 
                                        has_dP ? &dPdvt : nullptr,
                                        has_ddP ? &ddPdudut : nullptr, 
                                        has_ddP ? &ddPdvdvt : nullptr, 
                                        has_ddP ? &ddPdudvt : nullptr);
        
        if (has_P) {
          for (size_t j=i; j<min(i+4,valueCount); j++) 
            P[j] = Pt[j-i];
        }
        if (has_dP) 
        {
          for (size_t j=i; j<min(i+4,valueCount); j++) {
            dPdu[j] = dPdut[j-i];
            dPdv[j] = dPdvt[j-i];
          }
        }
        if (has_ddP) 
        {
          for (size_t j=i; j<min(i+4,valueCount); j++) {
            ddPdudu[j] = ddPdudut[j-i];
            ddPdvdv[j] = ddPdvdvt[j-i];
            ddPdudv[j] = ddPdudvt[j-i];
          }
        }
      }
    }